

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> * __thiscall
tinyusdz::GeomMesh::get_joints
          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__return_storage_ptr__,
          GeomMesh *this)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *this_00;
  Attribute *pAVar3;
  bool local_e1;
  undefined1 local_b8 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> dst;
  string local_98;
  allocator local_71;
  key_type local_70;
  mapped_type *local_50;
  mapped_type *prop;
  key_type local_40;
  char *local_20;
  char *kSkelJoints;
  GeomMesh *this_local;
  
  local_20 = "skel:joints";
  kSkelJoints = (char *)this;
  this_local = (GeomMesh *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"skel:joints",(allocator *)((long)&prop + 7));
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::count(&(this->super_GPrim).props,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)((long)&prop + 7));
  if (sVar2 == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector(__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"skel:joints",&local_71);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::at(&(this->super_GPrim).props,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_50 = this_00;
    pAVar3 = Property::get_attribute(this_00);
    bVar1 = Attribute::is_uniform(pAVar3);
    dst.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    local_e1 = false;
    if (bVar1) {
      pAVar3 = Property::get_attribute(local_50);
      Attribute::type_name_abi_cxx11_(&local_98,pAVar3);
      dst.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      local_e1 = std::operator==(&local_98,"token[]");
    }
    if ((dst.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_98);
    }
    if (local_e1 == false) {
      memset(__return_storage_ptr__,0,0x18);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector(__return_storage_ptr__)
      ;
    }
    else {
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_b8);
      pAVar3 = Property::get_attribute(local_50);
      bVar1 = Attribute::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                        (pAVar3,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                local_b8);
      if (bVar1) {
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                  (__return_storage_ptr__,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_b8);
      }
      else {
        memset(__return_storage_ptr__,0,0x18);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                  (__return_storage_ptr__);
      }
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_b8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value::token> GeomMesh::get_joints() const {
  constexpr auto kSkelJoints = "skel:joints";
#if 0
  if (has_primvar(kSkelJoints)) {
    // 'primvars:skel:joints'
    std::string err;
    GeomPrimvar primvar;
    if (!get_primvar(kSkelJoints, &primvar, &err)) {
      DCOUT("Invalid `skel:joints` primvar. err = " << err);
      return {};
    }

    if (primvar.has_indices()) {
      // indexed primvar for skel:joint is not supported 
      DCOUT("Indexed primvar is not supported for `skel:joints`");
      return {};
    }

    const Attribute &attr = primvar.get_attribute();
    if (!attr.is_uniform()) {
      DCOUT("`skel:joints` must be uniform attribute");
      return {};
    }

    std::vector<value::token> dst;
    if (!primvar.get_value(&dst)) {
      DCOUT("`skel:joints` must be token[] type, but got " << primvar.type_name());
    }
  } else {
#endif
  {
    // lookup `skel:joints` prop
    if (!props.count(kSkelJoints)) {
      return {};
    }

    const auto &prop = props.at(kSkelJoints);
    if (prop.get_attribute().is_uniform() && prop.get_attribute().type_name() == "token[]") {
      
      std::vector<value::token> dst;
      if (!prop.get_attribute().get_value(&dst)) {
        return {};
      }

      return dst;
      
    } 
    DCOUT("`skel:joints` must be uniform token[] attribute, but got " << prop.value_type_name() << " (or Relationship))");
  }
  return {};
}

// static
bool GeomSubset::ValidateSubsets(
    const std::vector<const GeomSubset *> &subsets,
    const size_t elementCount,
    const FamilyType &familyType, std::string *err) {

  if (subsets.empty()) {
    return true;
  }

  // All subsets must have the same elementType.
  GeomSubset::ElementType elementType = subsets[0]->elementType.get_value();
  for (const auto psubset : subsets) {
    if (psubset->elementType.get_value() != elementType) {
      if (err) {
        (*err) = fmt::format("GeomSubset {}'s elementType must be `{}`, but got `{}`.\n",
          psubset->name, to_string(elementType), to_string(psubset->elementType.get_value()));
      }

      return false;
    }
  }

  std::set<int32_t> indicesInFamily;

  bool valid = true;
  std::stringstream ss;

  // TODO: TimeSampled indices
  for (const auto psubset : subsets) {
    Animatable<std::vector<int32_t>> indices;
    if (!psubset->indices.get_value(&indices)) {
      ss << fmt::format("GeomSubset {}'s indices is not value Attribute. Connection or ValueBlock?\n",
          psubset->name);

      valid = false;
    }

    if (indices.is_blocked()) {
      ss << fmt::format("GeomSubset {}'s indices is Value Blocked.\n", psubset->name);
      valid = false;
    }

    if (indices.is_timesamples() || !indices.has_value()) {
      ss << fmt::format("ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n");
      valid = false;
    }

    std::vector<int32_t> subsetIndices;
    if (!indices.get_scalar(&subsetIndices)) {
      ss << fmt::format("ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n");
      valid = false;
    }

    for (const int32_t index : subsetIndices) {
      if (!indicesInFamily.insert(index).second && (familyType != FamilyType::Unrestricted)) {
        ss << fmt::format("Found overlapping index {} in GeomSubset `{}`\n", index, psubset->name);
        valid = false;
      }
    }
  }


  // Make sure every index appears exactly once if it's a partition.
  if ((familyType == FamilyType::Partition) && (indicesInFamily.size() != elementCount)) {
    ss << fmt::format("ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n", indicesInFamily.size(), elementCount);
    valid = false;
  }

  // Ensure that the indices are in the range [0, faceCount)
  size_t maxIndex = static_cast<size_t>(*indicesInFamily.rbegin());
  int minIndex = *indicesInFamily.begin();

  if (maxIndex >= elementCount) {
    ss << fmt::format("ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n", elementCount, maxIndex);

    valid = false;
  }

  if (minIndex < 0) {
    ss << fmt::format("ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n", minIndex);

    valid = false;
  }

  if (!valid) {
    if (err) {
      (*err) += ss.str();
    }
  }

  return true;

}

}